

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZPardisoSolver.cpp
# Opt level: O0

void __thiscall TPZPardisoSolver<float>::TPZPardisoSolver(TPZPardisoSolver<float> *this)

{
  TPZManVector<long_long,_64> *pTVar1;
  longlong *plVar2;
  void **in_RDI;
  TPZAutoPointer<TPZManVector<long_long,_64>_> *in_stack_ffffffffffffffb0;
  TPZManVector<long_long,_64> *rval;
  TPZAutoPointer<TPZManVector<long_long,_64>_> *this_00;
  TPZMatrixSolver<float> *in_stack_ffffffffffffffd0;
  
  TPZMatrixSolver<float>::TPZMatrixSolver(in_stack_ffffffffffffffd0,in_RDI);
  *in_RDI = &PTR__TPZPardisoSolver_023e1978;
  *(undefined4 *)(in_RDI + 0x15) = 0;
  *(undefined4 *)((long)in_RDI + 0xac) = 0;
  *(undefined4 *)(in_RDI + 0x16) = 0;
  pTVar1 = (TPZManVector<long_long,_64> *)(in_RDI + 0x17);
  TPZAutoPointer<TPZManVector<long_long,_64>_>::TPZAutoPointer(in_stack_ffffffffffffffb0);
  in_RDI[0x18] = (void *)0x0;
  this_00 = (TPZAutoPointer<TPZManVector<long_long,_64>_> *)(in_RDI + 0x19);
  TPZManVector<long_long,_64>::TPZManVector(pTVar1,(int64_t)in_RDI,(longlong *)this_00);
  in_RDI[0x5d] = (void *)0x1;
  in_RDI[0x5e] = (void *)0x1;
  in_RDI[0x5f] = (void *)0x0;
  in_RDI[0x60] = (void *)0x0;
  rval = (TPZManVector<long_long,_64> *)(in_RDI + 0x61);
  TPZVec<long_long>::TPZVec((TPZVec<long_long> *)rval);
  in_RDI[0x65] = (void *)0x0;
  *(undefined1 *)(in_RDI + 0x66) = 0;
  *(undefined1 *)((long)in_RDI + 0x331) = 0;
  operator_new(0x220);
  TPZManVector<long_long,_64>::TPZManVector(pTVar1,(int64_t)in_RDI,(longlong *)this_00);
  TPZAutoPointer<TPZManVector<long_long,_64>_>::operator=(this_00,rval);
  pTVar1 = TPZAutoPointer<TPZManVector<long_long,_64>_>::operator->
                     ((TPZAutoPointer<TPZManVector<long_long,_64>_> *)(in_RDI + 0x17));
  plVar2 = TPZVec<long_long>::operator[](&pTVar1->super_TPZVec<long_long>,0);
  in_RDI[0x18] = plVar2;
  return;
}

Assistant:

TPZPardisoSolver<TVar>::TPZPardisoSolver() :
    TPZMatrixSolver<TVar>(),fPardisoControl(),fParam(64,0)
{
    fPardisoControl = new TPZManVector<long long,64>(64,0);
    fHandle = &fPardisoControl.operator->()->operator[](0);
}